

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image_resize2.h
# Opt level: O1

void stbir__vertical_gather_with_6_coeffs
               (float *outputp,float *vertical_coefficients,float **inputs,float *input0_end)

{
  float *pfVar1;
  float *pfVar2;
  float *pfVar3;
  float *pfVar4;
  float *pfVar5;
  float *pfVar6;
  float *pfVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  float fVar18;
  float fVar19;
  float fVar20;
  float fVar21;
  float fVar22;
  float fVar23;
  float fVar24;
  float fVar25;
  float fVar26;
  float fVar27;
  float fVar28;
  float fVar29;
  float fVar30;
  float fVar31;
  float fVar32;
  float fVar33;
  float fVar34;
  float fVar35;
  float fVar36;
  float fVar37;
  float fVar38;
  float fVar39;
  float fVar40;
  float fVar41;
  float fVar42;
  float fVar43;
  float fVar44;
  float fVar45;
  float fVar46;
  float fVar47;
  float fVar48;
  float fVar49;
  float fVar50;
  float fVar51;
  float fVar52;
  float fVar53;
  float fVar54;
  float fVar55;
  float fVar56;
  float fVar57;
  float fVar58;
  float fVar59;
  float fVar60;
  float fVar61;
  float fVar62;
  float fVar63;
  float fVar64;
  float fVar65;
  float fVar66;
  float fVar67;
  float fVar68;
  float fVar69;
  float fVar70;
  float fVar71;
  float fVar72;
  float fVar73;
  float fVar74;
  float fVar75;
  float fVar76;
  float fVar77;
  float fVar78;
  float fVar79;
  float fVar80;
  float fVar81;
  float fVar82;
  float fVar83;
  float fVar84;
  float fVar85;
  float fVar86;
  float fVar87;
  float fVar88;
  float fVar89;
  float fVar90;
  float fVar91;
  float fVar92;
  float fVar93;
  float fVar94;
  float fVar95;
  float fVar96;
  float fVar97;
  float fVar98;
  float fVar99;
  float fVar100;
  float fVar101;
  float fVar102;
  float fVar103;
  float *pfVar104;
  float *pfVar105;
  long lVar106;
  long lVar107;
  float *pfVar108;
  float *pfVar109;
  float *pfVar110;
  float *pfVar111;
  
  pfVar104 = *inputs;
  pfVar108 = inputs[1];
  fVar8 = *vertical_coefficients;
  fVar9 = vertical_coefficients[1];
  pfVar109 = inputs[2];
  fVar10 = vertical_coefficients[2];
  pfVar110 = inputs[3];
  fVar11 = vertical_coefficients[3];
  pfVar111 = inputs[4];
  fVar12 = vertical_coefficients[4];
  pfVar105 = inputs[5];
  fVar13 = vertical_coefficients[5];
  lVar106 = (long)input0_end - (long)pfVar104;
  if (0x3f < lVar106) {
    lVar107 = 0;
    do {
      pfVar1 = (float *)((long)pfVar104 + lVar107);
      fVar14 = pfVar1[1];
      fVar15 = pfVar1[2];
      fVar16 = pfVar1[3];
      pfVar2 = (float *)((long)pfVar104 + lVar107 + 0x10);
      fVar17 = *pfVar2;
      fVar18 = pfVar2[1];
      fVar19 = pfVar2[2];
      fVar20 = pfVar2[3];
      pfVar2 = (float *)((long)pfVar104 + lVar107 + 0x20);
      fVar21 = *pfVar2;
      fVar22 = pfVar2[1];
      fVar23 = pfVar2[2];
      fVar24 = pfVar2[3];
      pfVar2 = (float *)((long)pfVar104 + lVar107 + 0x30);
      fVar25 = *pfVar2;
      fVar26 = pfVar2[1];
      fVar27 = pfVar2[2];
      fVar28 = pfVar2[3];
      pfVar2 = (float *)((long)pfVar108 + lVar107);
      fVar29 = pfVar2[1];
      fVar30 = pfVar2[2];
      fVar31 = pfVar2[3];
      pfVar3 = (float *)((long)pfVar108 + lVar107 + 0x10);
      fVar32 = *pfVar3;
      fVar33 = pfVar3[1];
      fVar34 = pfVar3[2];
      fVar35 = pfVar3[3];
      pfVar3 = (float *)((long)pfVar108 + lVar107 + 0x20);
      fVar36 = *pfVar3;
      fVar37 = pfVar3[1];
      fVar38 = pfVar3[2];
      fVar39 = pfVar3[3];
      pfVar3 = (float *)((long)pfVar108 + lVar107 + 0x30);
      fVar40 = *pfVar3;
      fVar41 = pfVar3[1];
      fVar42 = pfVar3[2];
      fVar43 = pfVar3[3];
      pfVar3 = (float *)((long)pfVar109 + lVar107);
      fVar44 = pfVar3[1];
      fVar45 = pfVar3[2];
      fVar46 = pfVar3[3];
      pfVar4 = (float *)((long)pfVar109 + lVar107 + 0x10);
      fVar47 = *pfVar4;
      fVar48 = pfVar4[1];
      fVar49 = pfVar4[2];
      fVar50 = pfVar4[3];
      pfVar4 = (float *)((long)pfVar109 + lVar107 + 0x20);
      fVar51 = *pfVar4;
      fVar52 = pfVar4[1];
      fVar53 = pfVar4[2];
      fVar54 = pfVar4[3];
      pfVar4 = (float *)((long)pfVar109 + lVar107 + 0x30);
      fVar55 = *pfVar4;
      fVar56 = pfVar4[1];
      fVar57 = pfVar4[2];
      fVar58 = pfVar4[3];
      pfVar4 = (float *)((long)pfVar110 + lVar107);
      fVar59 = pfVar4[1];
      fVar60 = pfVar4[2];
      fVar61 = pfVar4[3];
      pfVar5 = (float *)((long)pfVar110 + lVar107 + 0x10);
      fVar62 = *pfVar5;
      fVar63 = pfVar5[1];
      fVar64 = pfVar5[2];
      fVar65 = pfVar5[3];
      pfVar5 = (float *)((long)pfVar110 + lVar107 + 0x20);
      fVar66 = *pfVar5;
      fVar67 = pfVar5[1];
      fVar68 = pfVar5[2];
      fVar69 = pfVar5[3];
      pfVar5 = (float *)((long)pfVar110 + lVar107 + 0x30);
      fVar70 = *pfVar5;
      fVar71 = pfVar5[1];
      fVar72 = pfVar5[2];
      fVar73 = pfVar5[3];
      pfVar5 = (float *)((long)pfVar111 + lVar107);
      fVar74 = pfVar5[1];
      fVar75 = pfVar5[2];
      fVar76 = pfVar5[3];
      pfVar6 = (float *)((long)pfVar111 + lVar107 + 0x10);
      fVar77 = *pfVar6;
      fVar78 = pfVar6[1];
      fVar79 = pfVar6[2];
      fVar80 = pfVar6[3];
      pfVar6 = (float *)((long)pfVar111 + lVar107 + 0x20);
      fVar81 = *pfVar6;
      fVar82 = pfVar6[1];
      fVar83 = pfVar6[2];
      fVar84 = pfVar6[3];
      pfVar6 = (float *)((long)pfVar111 + lVar107 + 0x30);
      fVar85 = *pfVar6;
      fVar86 = pfVar6[1];
      fVar87 = pfVar6[2];
      fVar88 = pfVar6[3];
      pfVar6 = (float *)((long)pfVar105 + lVar107);
      fVar89 = pfVar6[1];
      fVar90 = pfVar6[2];
      fVar91 = pfVar6[3];
      pfVar7 = (float *)((long)pfVar105 + lVar107 + 0x10);
      fVar92 = *pfVar7;
      fVar93 = pfVar7[1];
      fVar94 = pfVar7[2];
      fVar95 = pfVar7[3];
      pfVar7 = (float *)((long)pfVar105 + lVar107 + 0x20);
      fVar96 = *pfVar7;
      fVar97 = pfVar7[1];
      fVar98 = pfVar7[2];
      fVar99 = pfVar7[3];
      pfVar7 = (float *)((long)pfVar105 + lVar107 + 0x30);
      fVar100 = *pfVar7;
      fVar101 = pfVar7[1];
      fVar102 = pfVar7[2];
      fVar103 = pfVar7[3];
      pfVar7 = (float *)((long)outputp + lVar107);
      *pfVar7 = *pfVar6 * fVar13 +
                *pfVar5 * fVar12 +
                *pfVar4 * fVar11 + *pfVar3 * fVar10 + *pfVar2 * fVar9 + *pfVar1 * fVar8;
      pfVar7[1] = fVar89 * fVar13 +
                  fVar74 * fVar12 +
                  fVar59 * fVar11 + fVar44 * fVar10 + fVar29 * fVar9 + fVar14 * fVar8;
      pfVar7[2] = fVar90 * fVar13 +
                  fVar75 * fVar12 +
                  fVar60 * fVar11 + fVar45 * fVar10 + fVar30 * fVar9 + fVar15 * fVar8;
      pfVar7[3] = fVar91 * fVar13 +
                  fVar76 * fVar12 +
                  fVar61 * fVar11 + fVar46 * fVar10 + fVar31 * fVar9 + fVar16 * fVar8;
      pfVar1 = (float *)((long)outputp + lVar107 + 0x10);
      *pfVar1 = fVar92 * fVar13 +
                fVar77 * fVar12 +
                fVar62 * fVar11 + fVar47 * fVar10 + fVar32 * fVar9 + fVar17 * fVar8;
      pfVar1[1] = fVar93 * fVar13 +
                  fVar78 * fVar12 +
                  fVar63 * fVar11 + fVar48 * fVar10 + fVar33 * fVar9 + fVar18 * fVar8;
      pfVar1[2] = fVar94 * fVar13 +
                  fVar79 * fVar12 +
                  fVar64 * fVar11 + fVar49 * fVar10 + fVar34 * fVar9 + fVar19 * fVar8;
      pfVar1[3] = fVar95 * fVar13 +
                  fVar80 * fVar12 +
                  fVar65 * fVar11 + fVar50 * fVar10 + fVar35 * fVar9 + fVar20 * fVar8;
      pfVar1 = (float *)((long)outputp + lVar107 + 0x20);
      *pfVar1 = fVar96 * fVar13 +
                fVar81 * fVar12 +
                fVar66 * fVar11 + fVar51 * fVar10 + fVar36 * fVar9 + fVar21 * fVar8;
      pfVar1[1] = fVar97 * fVar13 +
                  fVar82 * fVar12 +
                  fVar67 * fVar11 + fVar52 * fVar10 + fVar37 * fVar9 + fVar22 * fVar8;
      pfVar1[2] = fVar98 * fVar13 +
                  fVar83 * fVar12 +
                  fVar68 * fVar11 + fVar53 * fVar10 + fVar38 * fVar9 + fVar23 * fVar8;
      pfVar1[3] = fVar99 * fVar13 +
                  fVar84 * fVar12 +
                  fVar69 * fVar11 + fVar54 * fVar10 + fVar39 * fVar9 + fVar24 * fVar8;
      pfVar1 = (float *)((long)outputp + lVar107 + 0x30);
      *pfVar1 = fVar100 * fVar13 +
                fVar85 * fVar12 +
                fVar70 * fVar11 + fVar55 * fVar10 + fVar40 * fVar9 + fVar25 * fVar8;
      pfVar1[1] = fVar101 * fVar13 +
                  fVar86 * fVar12 +
                  fVar71 * fVar11 + fVar56 * fVar10 + fVar41 * fVar9 + fVar26 * fVar8;
      pfVar1[2] = fVar102 * fVar13 +
                  fVar87 * fVar12 +
                  fVar72 * fVar11 + fVar57 * fVar10 + fVar42 * fVar9 + fVar27 * fVar8;
      pfVar1[3] = fVar103 * fVar13 +
                  fVar88 * fVar12 +
                  fVar73 * fVar11 + fVar58 * fVar10 + fVar43 * fVar9 + fVar28 * fVar8;
      lVar107 = lVar107 + 0x40;
      lVar106 = lVar106 + -0x40;
    } while (0x3f < lVar106);
    outputp = (float *)((long)outputp + lVar107);
    pfVar104 = (float *)((long)pfVar104 + lVar107);
    pfVar108 = (float *)((long)pfVar108 + lVar107);
    pfVar109 = (float *)((long)pfVar109 + lVar107);
    pfVar110 = (float *)((long)pfVar110 + lVar107);
    pfVar111 = (float *)((long)pfVar111 + lVar107);
    pfVar105 = (float *)((long)pfVar105 + lVar107);
  }
  lVar106 = (long)input0_end - (long)pfVar104;
  if (0xf < lVar106) {
    lVar107 = 0;
    do {
      pfVar1 = (float *)((long)pfVar104 + lVar107);
      fVar14 = pfVar1[1];
      fVar15 = pfVar1[2];
      fVar16 = pfVar1[3];
      pfVar2 = (float *)((long)pfVar108 + lVar107);
      fVar17 = pfVar2[1];
      fVar18 = pfVar2[2];
      fVar19 = pfVar2[3];
      pfVar3 = (float *)((long)pfVar109 + lVar107);
      fVar20 = pfVar3[1];
      fVar21 = pfVar3[2];
      fVar22 = pfVar3[3];
      pfVar4 = (float *)((long)pfVar110 + lVar107);
      fVar23 = pfVar4[1];
      fVar24 = pfVar4[2];
      fVar25 = pfVar4[3];
      pfVar5 = (float *)((long)pfVar111 + lVar107);
      fVar26 = pfVar5[1];
      fVar27 = pfVar5[2];
      fVar28 = pfVar5[3];
      pfVar6 = (float *)((long)pfVar105 + lVar107);
      fVar29 = pfVar6[1];
      fVar30 = pfVar6[2];
      fVar31 = pfVar6[3];
      pfVar7 = (float *)((long)outputp + lVar107);
      *pfVar7 = *pfVar6 * fVar13 +
                *pfVar5 * fVar12 +
                *pfVar4 * fVar11 + *pfVar3 * fVar10 + *pfVar2 * fVar9 + *pfVar1 * fVar8;
      pfVar7[1] = fVar29 * fVar13 +
                  fVar26 * fVar12 +
                  fVar23 * fVar11 + fVar20 * fVar10 + fVar17 * fVar9 + fVar14 * fVar8;
      pfVar7[2] = fVar30 * fVar13 +
                  fVar27 * fVar12 +
                  fVar24 * fVar11 + fVar21 * fVar10 + fVar18 * fVar9 + fVar15 * fVar8;
      pfVar7[3] = fVar31 * fVar13 +
                  fVar28 * fVar12 +
                  fVar25 * fVar11 + fVar22 * fVar10 + fVar19 * fVar9 + fVar16 * fVar8;
      lVar107 = lVar107 + 0x10;
      lVar106 = lVar106 + -0x10;
    } while (0xf < lVar106);
    outputp = (float *)((long)outputp + lVar107);
    pfVar104 = (float *)((long)pfVar104 + lVar107);
    pfVar108 = (float *)((long)pfVar108 + lVar107);
    pfVar109 = (float *)((long)pfVar109 + lVar107);
    pfVar110 = (float *)((long)pfVar110 + lVar107);
    pfVar111 = (float *)((long)pfVar111 + lVar107);
    pfVar105 = (float *)((long)pfVar105 + lVar107);
  }
  if (pfVar104 < input0_end) {
    lVar106 = 0;
    do {
      pfVar1 = (float *)((long)pfVar104 + lVar106);
      *(float *)((long)outputp + lVar106) =
           *(float *)((long)pfVar105 + lVar106) * fVar13 +
           *(float *)((long)pfVar111 + lVar106) * fVar12 +
           *(float *)((long)pfVar110 + lVar106) * fVar11 +
           *(float *)((long)pfVar109 + lVar106) * fVar10 +
           *(float *)((long)pfVar108 + lVar106) * fVar9 + *pfVar1 * fVar8;
      lVar106 = lVar106 + 4;
    } while (pfVar1 + 1 < input0_end);
  }
  return;
}

Assistant:

static void STBIR_chans( stbir__vertical_gather_with_,_coeffs)( float * outputp, float const * vertical_coefficients, float const ** inputs, float const * input0_end )
{
  float STBIR_SIMD_STREAMOUT_PTR( * ) output = outputp;

  stbIF0( float const * input0 = inputs[0]; float c0s = vertical_coefficients[0]; )
  stbIF1( float const * input1 = inputs[1]; float c1s = vertical_coefficients[1]; )
  stbIF2( float const * input2 = inputs[2]; float c2s = vertical_coefficients[2]; )
  stbIF3( float const * input3 = inputs[3]; float c3s = vertical_coefficients[3]; )
  stbIF4( float const * input4 = inputs[4]; float c4s = vertical_coefficients[4]; )
  stbIF5( float const * input5 = inputs[5]; float c5s = vertical_coefficients[5]; )
  stbIF6( float const * input6 = inputs[6]; float c6s = vertical_coefficients[6]; )
  stbIF7( float const * input7 = inputs[7]; float c7s = vertical_coefficients[7]; )

#if ( STBIR__vertical_channels == 1 ) && !defined(STB_IMAGE_RESIZE_VERTICAL_CONTINUE)
  // check single channel one weight
  if ( ( c0s >= (1.0f-0.000001f) ) && ( c0s <= (1.0f+0.000001f) ) )
  {
    STBIR_MEMCPY( output, input0, (char*)input0_end - (char*)input0 );
    return;
  }
#endif

  #ifdef STBIR_SIMD
  {
    stbIF0(stbir__simdfX c0 = stbir__simdf_frepX( c0s ); )
    stbIF1(stbir__simdfX c1 = stbir__simdf_frepX( c1s ); )
    stbIF2(stbir__simdfX c2 = stbir__simdf_frepX( c2s ); )
    stbIF3(stbir__simdfX c3 = stbir__simdf_frepX( c3s ); )
    stbIF4(stbir__simdfX c4 = stbir__simdf_frepX( c4s ); )
    stbIF5(stbir__simdfX c5 = stbir__simdf_frepX( c5s ); )
    stbIF6(stbir__simdfX c6 = stbir__simdf_frepX( c6s ); )
    stbIF7(stbir__simdfX c7 = stbir__simdf_frepX( c7s ); )

    STBIR_SIMD_NO_UNROLL_LOOP_START
    while ( ( (char*)input0_end - (char*) input0 ) >= (16*stbir__simdfX_float_count) )
    {
      stbir__simdfX o0, o1, o2, o3, r0, r1, r2, r3;
      STBIR_SIMD_NO_UNROLL(output);

      // prefetch four loop iterations ahead (doesn't affect much for small resizes, but helps with big ones)
      stbIF0( stbir__prefetch( input0 + (16*stbir__simdfX_float_count) ); )
      stbIF1( stbir__prefetch( input1 + (16*stbir__simdfX_float_count) ); )
      stbIF2( stbir__prefetch( input2 + (16*stbir__simdfX_float_count) ); )
      stbIF3( stbir__prefetch( input3 + (16*stbir__simdfX_float_count) ); )
      stbIF4( stbir__prefetch( input4 + (16*stbir__simdfX_float_count) ); )
      stbIF5( stbir__prefetch( input5 + (16*stbir__simdfX_float_count) ); )
      stbIF6( stbir__prefetch( input6 + (16*stbir__simdfX_float_count) ); )
      stbIF7( stbir__prefetch( input7 + (16*stbir__simdfX_float_count) ); )

      #ifdef STB_IMAGE_RESIZE_VERTICAL_CONTINUE
      stbIF0( stbir__simdfX_load( o0, output );      stbir__simdfX_load( o1, output+stbir__simdfX_float_count );   stbir__simdfX_load( o2, output+(2*stbir__simdfX_float_count) );   stbir__simdfX_load( o3, output+(3*stbir__simdfX_float_count) );
              stbir__simdfX_load( r0, input0 );      stbir__simdfX_load( r1, input0+stbir__simdfX_float_count );   stbir__simdfX_load( r2, input0+(2*stbir__simdfX_float_count) );   stbir__simdfX_load( r3, input0+(3*stbir__simdfX_float_count) );
              stbir__simdfX_madd( o0, o0, r0, c0 );  stbir__simdfX_madd( o1, o1, r1, c0 );                         stbir__simdfX_madd( o2, o2, r2, c0 );                             stbir__simdfX_madd( o3, o3, r3, c0 ); )
      #else
      stbIF0( stbir__simdfX_load( r0, input0 );      stbir__simdfX_load( r1, input0+stbir__simdfX_float_count );   stbir__simdfX_load( r2, input0+(2*stbir__simdfX_float_count) );   stbir__simdfX_load( r3, input0+(3*stbir__simdfX_float_count) );
              stbir__simdfX_mult( o0, r0, c0 );      stbir__simdfX_mult( o1, r1, c0 );                             stbir__simdfX_mult( o2, r2, c0 );                                 stbir__simdfX_mult( o3, r3, c0 );  )
      #endif

      stbIF1( stbir__simdfX_load( r0, input1 );      stbir__simdfX_load( r1, input1+stbir__simdfX_float_count );   stbir__simdfX_load( r2, input1+(2*stbir__simdfX_float_count) );   stbir__simdfX_load( r3, input1+(3*stbir__simdfX_float_count) );
              stbir__simdfX_madd( o0, o0, r0, c1 );  stbir__simdfX_madd( o1, o1, r1, c1 );                         stbir__simdfX_madd( o2, o2, r2, c1 );                             stbir__simdfX_madd( o3, o3, r3, c1 ); )
      stbIF2( stbir__simdfX_load( r0, input2 );      stbir__simdfX_load( r1, input2+stbir__simdfX_float_count );   stbir__simdfX_load( r2, input2+(2*stbir__simdfX_float_count) );   stbir__simdfX_load( r3, input2+(3*stbir__simdfX_float_count) );
              stbir__simdfX_madd( o0, o0, r0, c2 );  stbir__simdfX_madd( o1, o1, r1, c2 );                         stbir__simdfX_madd( o2, o2, r2, c2 );                             stbir__simdfX_madd( o3, o3, r3, c2 ); )
      stbIF3( stbir__simdfX_load( r0, input3 );      stbir__simdfX_load( r1, input3+stbir__simdfX_float_count );   stbir__simdfX_load( r2, input3+(2*stbir__simdfX_float_count) );   stbir__simdfX_load( r3, input3+(3*stbir__simdfX_float_count) );
              stbir__simdfX_madd( o0, o0, r0, c3 );  stbir__simdfX_madd( o1, o1, r1, c3 );                         stbir__simdfX_madd( o2, o2, r2, c3 );                             stbir__simdfX_madd( o3, o3, r3, c3 ); )
      stbIF4( stbir__simdfX_load( r0, input4 );      stbir__simdfX_load( r1, input4+stbir__simdfX_float_count );   stbir__simdfX_load( r2, input4+(2*stbir__simdfX_float_count) );   stbir__simdfX_load( r3, input4+(3*stbir__simdfX_float_count) );
              stbir__simdfX_madd( o0, o0, r0, c4 );  stbir__simdfX_madd( o1, o1, r1, c4 );                         stbir__simdfX_madd( o2, o2, r2, c4 );                             stbir__simdfX_madd( o3, o3, r3, c4 ); )
      stbIF5( stbir__simdfX_load( r0, input5 );      stbir__simdfX_load( r1, input5+stbir__simdfX_float_count );   stbir__simdfX_load( r2, input5+(2*stbir__simdfX_float_count) );   stbir__simdfX_load( r3, input5+(3*stbir__simdfX_float_count) );
              stbir__simdfX_madd( o0, o0, r0, c5 );  stbir__simdfX_madd( o1, o1, r1, c5 );                         stbir__simdfX_madd( o2, o2, r2, c5 );                             stbir__simdfX_madd( o3, o3, r3, c5 ); )
      stbIF6( stbir__simdfX_load( r0, input6 );      stbir__simdfX_load( r1, input6+stbir__simdfX_float_count );   stbir__simdfX_load( r2, input6+(2*stbir__simdfX_float_count) );   stbir__simdfX_load( r3, input6+(3*stbir__simdfX_float_count) );
              stbir__simdfX_madd( o0, o0, r0, c6 );  stbir__simdfX_madd( o1, o1, r1, c6 );                         stbir__simdfX_madd( o2, o2, r2, c6 );                             stbir__simdfX_madd( o3, o3, r3, c6 ); )
      stbIF7( stbir__simdfX_load( r0, input7 );      stbir__simdfX_load( r1, input7+stbir__simdfX_float_count );   stbir__simdfX_load( r2, input7+(2*stbir__simdfX_float_count) );   stbir__simdfX_load( r3, input7+(3*stbir__simdfX_float_count) );
              stbir__simdfX_madd( o0, o0, r0, c7 );  stbir__simdfX_madd( o1, o1, r1, c7 );                         stbir__simdfX_madd( o2, o2, r2, c7 );                             stbir__simdfX_madd( o3, o3, r3, c7 ); )

      stbir__simdfX_store( output, o0 );             stbir__simdfX_store( output+stbir__simdfX_float_count, o1 );  stbir__simdfX_store( output+(2*stbir__simdfX_float_count), o2 );  stbir__simdfX_store( output+(3*stbir__simdfX_float_count), o3 );
      output += (4*stbir__simdfX_float_count);
      stbIF0( input0 += (4*stbir__simdfX_float_count); ) stbIF1( input1 += (4*stbir__simdfX_float_count); ) stbIF2( input2 += (4*stbir__simdfX_float_count); ) stbIF3( input3 += (4*stbir__simdfX_float_count); ) stbIF4( input4 += (4*stbir__simdfX_float_count); ) stbIF5( input5 += (4*stbir__simdfX_float_count); ) stbIF6( input6 += (4*stbir__simdfX_float_count); ) stbIF7( input7 += (4*stbir__simdfX_float_count); )
    }

    STBIR_SIMD_NO_UNROLL_LOOP_START
    while ( ( (char*)input0_end - (char*) input0 ) >= 16 )
    {
      stbir__simdf o0, r0;
      STBIR_SIMD_NO_UNROLL(output);

      #ifdef STB_IMAGE_RESIZE_VERTICAL_CONTINUE
      stbIF0( stbir__simdf_load( o0, output );   stbir__simdf_load( r0, input0 ); stbir__simdf_madd( o0, o0, r0, stbir__if_simdf8_cast_to_simdf4( c0 ) ); )
      #else
      stbIF0( stbir__simdf_load( r0, input0 );  stbir__simdf_mult( o0, r0, stbir__if_simdf8_cast_to_simdf4( c0 ) ); )
      #endif
      stbIF1( stbir__simdf_load( r0, input1 );  stbir__simdf_madd( o0, o0, r0, stbir__if_simdf8_cast_to_simdf4( c1 ) ); )
      stbIF2( stbir__simdf_load( r0, input2 );  stbir__simdf_madd( o0, o0, r0, stbir__if_simdf8_cast_to_simdf4( c2 ) ); )
      stbIF3( stbir__simdf_load( r0, input3 );  stbir__simdf_madd( o0, o0, r0, stbir__if_simdf8_cast_to_simdf4( c3 ) ); )
      stbIF4( stbir__simdf_load( r0, input4 );  stbir__simdf_madd( o0, o0, r0, stbir__if_simdf8_cast_to_simdf4( c4 ) ); )
      stbIF5( stbir__simdf_load( r0, input5 );  stbir__simdf_madd( o0, o0, r0, stbir__if_simdf8_cast_to_simdf4( c5 ) ); )
      stbIF6( stbir__simdf_load( r0, input6 );  stbir__simdf_madd( o0, o0, r0, stbir__if_simdf8_cast_to_simdf4( c6 ) ); )
      stbIF7( stbir__simdf_load( r0, input7 );  stbir__simdf_madd( o0, o0, r0, stbir__if_simdf8_cast_to_simdf4( c7 ) ); )

      stbir__simdf_store( output, o0 );
      output += 4;
      stbIF0( input0 += 4; ) stbIF1( input1 += 4; ) stbIF2( input2 += 4; ) stbIF3( input3 += 4; ) stbIF4( input4 += 4; ) stbIF5( input5 += 4; ) stbIF6( input6 += 4; ) stbIF7( input7 += 4; )
    }
  }
  #else
  STBIR_NO_UNROLL_LOOP_START
  while ( ( (char*)input0_end - (char*) input0 ) >= 16 )
  {
    float o0, o1, o2, o3;
    STBIR_NO_UNROLL(output);
    #ifdef STB_IMAGE_RESIZE_VERTICAL_CONTINUE
    stbIF0( o0 = output[0] + input0[0] * c0s; o1 = output[1] + input0[1] * c0s; o2 = output[2] + input0[2] * c0s; o3 = output[3] + input0[3] * c0s; )
    #else
    stbIF0( o0  = input0[0] * c0s; o1  = input0[1] * c0s; o2  = input0[2] * c0s; o3  = input0[3] * c0s; )
    #endif
    stbIF1( o0 += input1[0] * c1s; o1 += input1[1] * c1s; o2 += input1[2] * c1s; o3 += input1[3] * c1s; )
    stbIF2( o0 += input2[0] * c2s; o1 += input2[1] * c2s; o2 += input2[2] * c2s; o3 += input2[3] * c2s; )
    stbIF3( o0 += input3[0] * c3s; o1 += input3[1] * c3s; o2 += input3[2] * c3s; o3 += input3[3] * c3s; )
    stbIF4( o0 += input4[0] * c4s; o1 += input4[1] * c4s; o2 += input4[2] * c4s; o3 += input4[3] * c4s; )
    stbIF5( o0 += input5[0] * c5s; o1 += input5[1] * c5s; o2 += input5[2] * c5s; o3 += input5[3] * c5s; )
    stbIF6( o0 += input6[0] * c6s; o1 += input6[1] * c6s; o2 += input6[2] * c6s; o3 += input6[3] * c6s; )
    stbIF7( o0 += input7[0] * c7s; o1 += input7[1] * c7s; o2 += input7[2] * c7s; o3 += input7[3] * c7s; )
    output[0] = o0; output[1] = o1; output[2] = o2; output[3] = o3;
    output += 4;
    stbIF0( input0 += 4; ) stbIF1( input1 += 4; ) stbIF2( input2 += 4; ) stbIF3( input3 += 4; ) stbIF4( input4 += 4; ) stbIF5( input5 += 4; ) stbIF6( input6 += 4; ) stbIF7( input7 += 4; )
  }
  #endif
  STBIR_NO_UNROLL_LOOP_START
  while ( input0 < input0_end )
  {
    float o0;
    STBIR_NO_UNROLL(output);
    #ifdef STB_IMAGE_RESIZE_VERTICAL_CONTINUE
    stbIF0( o0 = output[0] + input0[0] * c0s; )
    #else
    stbIF0( o0  = input0[0] * c0s; )
    #endif
    stbIF1( o0 += input1[0] * c1s; )
    stbIF2( o0 += input2[0] * c2s; )
    stbIF3( o0 += input3[0] * c3s; )
    stbIF4( o0 += input4[0] * c4s; )
    stbIF5( o0 += input5[0] * c5s; )
    stbIF6( o0 += input6[0] * c6s; )
    stbIF7( o0 += input7[0] * c7s; )
    output[0] = o0;
    ++output;
    stbIF0( ++input0; ) stbIF1( ++input1; ) stbIF2( ++input2; ) stbIF3( ++input3; ) stbIF4( ++input4; ) stbIF5( ++input5; ) stbIF6( ++input6; ) stbIF7( ++input7; )
  }
}